

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::SetPropertyValueInfo
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          PropertyValueInfo *info,RecyclableObject *instance,
          SimpleDictionaryPropertyDescriptor<int> *descriptor)

{
  bool bVar1;
  SimpleDictionaryPropertyDescriptor<int> *descriptor_local;
  RecyclableObject *instance_local;
  PropertyValueInfo *info_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  SetPropertyValueInfoNonFixed
            (this,info,instance,descriptor->propertyIndex,descriptor->Attributes,InlineCacheNoFlags)
  ;
  bVar1 = SimpleDictionaryPropertyDescriptor<int>::IsOrMayBecomeFixed(descriptor);
  if (bVar1) {
    PropertyValueInfo::DisableStoreFieldCache(info);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyValueInfo(PropertyValueInfo* info, RecyclableObject* instance, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor)
    {
        SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
        if (descriptor->IsOrMayBecomeFixed())
        {
            PropertyValueInfo::DisableStoreFieldCache(info);
        }
    }